

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::InitMaterialData
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,TPZMaterialData *data)

{
  int64_t iVar1;
  int iVar2;
  undefined4 uVar3;
  TPZGeoEl *pTVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  long newRows;
  int i;
  ulong uVar8;
  uint64_t ducol;
  uint64_t durow;
  uint64_t ulen;
  TPZManVector<long,_2> ids;
  TPZManVector<int,_3> orders;
  TPZManVector<int,_2> sideorient;
  
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  data->gelElId = (int)pTVar4->fId;
  lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar5 == 0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)__dynamic_cast(lVar5,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
  }
  TPZManVector<long,_2>::TPZManVector(&ids,2);
  TPZManVector<int,_3>::TPZManVector(&orders,1);
  ulen._0_4_ = 0;
  TPZManVector<int,_2>::TPZManVector(&sideorient,2,(int *)&ulen);
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    lVar5 = (**(code **)(*(long *)pTVar4 + 0xa8))(pTVar4,uVar8 & 0xffffffff);
    ids.super_TPZVec<long>.fStore[uVar8] = lVar5;
  }
  lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xa8))(this,2);
  *orders.super_TPZVec<int>.fStore = (uint)*(byte *)(lVar5 + 0x14);
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize
            (&ids.super_TPZVec<long>,&orders.super_TPZVec<int>,&data->super_TPZShapeData);
  (**(code **)(*plVar6 + 0x48))(plVar6,data);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb0))(this);
  iVar1 = (data->super_TPZShapeData).fPhi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  plVar7 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  uVar3 = (**(code **)(*plVar7 + 0x78))(plVar7);
  (data->super_TPZShapeData).fShapeType = EScalarShape;
  lVar5 = (long)(int)iVar1;
  TPZFMatrix<double>::Redim(&(data->phi).super_TPZFMatrix<double>,lVar5,1);
  newRows = (long)iVar2;
  TPZFMatrix<double>::Redim(&(data->dphix).super_TPZFMatrix<double>,newRows,lVar5);
  TPZFMatrix<double>::Redim(&(data->axes).super_TPZFMatrix<double>,newRows,3);
  TPZFMatrix<double>::Redim(&(data->jacobian).super_TPZFMatrix<double>,newRows,newRows);
  TPZFMatrix<double>::Redim(&(data->jacinv).super_TPZFMatrix<double>,newRows,newRows);
  TPZManVector<double,_3>::Resize(&data->x,3);
  if (data->fNeedsSol == true) {
    (**(code **)(*plVar6 + 0x60))(plVar6,&ulen,&durow,&ducol);
    (**(code **)(*(long *)&data->super_TPZShapeData + 0x50))
              (data,uVar3,(undefined4)ulen,(undefined4)durow,(undefined4)ducol);
  }
  if (data->fNeedsNeighborCenter == true) {
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&ulen,pTVar4);
    TPZGeoElSide::CenterX((TPZGeoElSide *)&ulen,&(data->XCenter).super_TPZVec<double>);
  }
  TPZManVector<int,_2>::~TPZManVector(&sideorient);
  TPZManVector<int,_3>::~TPZManVector(&orders);
  TPZManVector<long,_2>::~TPZManVector(&ids);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::InitMaterialData(TPZMaterialData &data){
  data.gelElId = this->Reference()->Id();
    auto *mat =
        dynamic_cast<TPZMatSingleSpace*>(this->Material());
#ifdef PZDEBUG
    if(!mat)
    {
        DebugStop();
    }
#endif
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NSides-TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    for(int i=TSHAPE::NCornerNodes; i<TSHAPE::NSides; i++) orders[i-TSHAPE::NCornerNodes] = this->Connect(i).Order();
    TPZShapeData &shapedata = data;
    TPZShapeH1<TSHAPE>::Initialize(ids, orders, shapedata);
    mat->FillDataRequirements(data);
    const int dim = this->Dimension();
    const int nshape = data.fPhi.Rows();
    const int nstate = this->Material()->NStateVariables();
    data.fShapeType = TPZMaterialData::EScalarShape;
    data.phi.Redim(nshape,1);
//    data.dphi.Redim(dim,nshape);
    data.dphix.Redim(dim,nshape);
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
    if (data.fNeedsSol){
        uint64_t ulen,durow,ducol;
        mat->GetSolDimensions(ulen,durow,ducol);
        data.SetSolSizes(nstate, ulen, durow, ducol);
    }
    if(data.fNeedsNeighborCenter)
    {
        TPZGeoElSide gelside(gel);
        gelside.CenterX(data.XCenter);
    }
    
}